

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool __thiscall
ON_Font::Internal_SetFontWeightTrio
          (ON_Font *this,Weight font_weight,int windows_logfont_weight,
          double apple_font_weight_trait,bool bUpdateFontDescription)

{
  Weight font_weight_00;
  bool bVar1;
  double dStack_28;
  bool bUpdateFontDescription_local;
  double apple_font_weight_trait_local;
  int windows_logfont_weight_local;
  Weight font_weight_local;
  ON_Font *this_local;
  
  apple_font_weight_trait_local._7_1_ = font_weight;
  if (font_weight == Unset) {
    if ((windows_logfont_weight < 1) || (1000 < windows_logfont_weight)) {
      if ((-1.0 <= apple_font_weight_trait) && (apple_font_weight_trait <= 1.0)) {
        apple_font_weight_trait_local._7_1_ =
             WeightFromAppleFontWeightTrait(apple_font_weight_trait);
      }
    }
    else {
      apple_font_weight_trait_local._7_1_ = WeightFromWindowsLogfontWeight(windows_logfont_weight);
    }
  }
  font_weight_00 = FontWeightFromUnsigned((uint)apple_font_weight_trait_local._7_1_);
  if (font_weight_00 == Unset) {
    this_local._7_1_ = false;
  }
  else {
    apple_font_weight_trait_local._0_4_ = windows_logfont_weight;
    if (windows_logfont_weight < 1 || 1000 < windows_logfont_weight) {
      apple_font_weight_trait_local._0_4_ = WindowsLogfontWeightFromWeight(font_weight_00);
    }
    dStack_28 = apple_font_weight_trait;
    if (apple_font_weight_trait < -1.0 || 1.0 < apple_font_weight_trait) {
      dStack_28 = AppleFontWeightTraitFromWeight(font_weight_00);
    }
    if (((font_weight_00 != this->m_font_weight) || (dStack_28 != this->m_apple_font_weight_trait))
       || (apple_font_weight_trait_local._0_4_ != this->m_windows_logfont_weight)) {
      bVar1 = ModificationPermitted
                        (this,"",
                         "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                         ,0x2dfd);
      if (!bVar1) {
        return false;
      }
      if (font_weight_00 != this->m_font_weight) {
        this->m_font_weight = font_weight_00;
      }
      if (dStack_28 != this->m_apple_font_weight_trait) {
        this->m_apple_font_weight_trait = dStack_28;
      }
      if (apple_font_weight_trait_local._0_4_ != this->m_windows_logfont_weight) {
        this->m_windows_logfont_weight = apple_font_weight_trait_local._0_4_;
      }
      Internal_AfterModification(this);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Font::Internal_SetFontWeightTrio(
  ON_Font::Weight font_weight,
  int windows_logfont_weight,
  double apple_font_weight_trait,
  bool bUpdateFontDescription
)
{
  if (ON_Font::Weight::Unset == font_weight)
  {
    if (windows_logfont_weight > 0 && windows_logfont_weight <= 1000)
    {
      font_weight = ON_Font::WeightFromWindowsLogfontWeight(windows_logfont_weight);
    }
    else if (-1.0 <= apple_font_weight_trait && apple_font_weight_trait <= 1.0)
    {
      font_weight = ON_Font::WeightFromAppleFontWeightTrait(apple_font_weight_trait);
    }
  }

  font_weight = ON_Font::FontWeightFromUnsigned((unsigned int)static_cast<unsigned char>(font_weight));
  if (ON_Font::Weight::Unset == font_weight)
    return false;

  if (false == (1 <= windows_logfont_weight && windows_logfont_weight <= 1000))
    windows_logfont_weight = ON_Font::WindowsLogfontWeightFromWeight(font_weight);

  if (false == (-1.0 <= apple_font_weight_trait && apple_font_weight_trait <= 1.0) )
    apple_font_weight_trait = ON_Font::AppleFontWeightTraitFromWeight(font_weight);
  
  if ( 
    font_weight != m_font_weight
    || false == (apple_font_weight_trait == m_apple_font_weight_trait) // handles nans correctly
    || windows_logfont_weight != m_windows_logfont_weight
    )
  {
    if (false == ON_FONT_MODIFICATION_PERMITTED)
      return false;
    
    if (font_weight != m_font_weight)
    {
      m_font_weight = font_weight;
    }

    if (false == (apple_font_weight_trait == m_apple_font_weight_trait))
      m_apple_font_weight_trait = apple_font_weight_trait;

    if (windows_logfont_weight != m_windows_logfont_weight)
      m_windows_logfont_weight = windows_logfont_weight;

    Internal_AfterModification();
  }

  return true;
}